

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int Score(string *modelFile)

{
  string *text;
  uint64_t *__return_storage_ptr__;
  bool bVar1;
  ostream *poVar2;
  istream *piVar3;
  int iVar4;
  double dVar5;
  undefined1 local_168 [8];
  TLangModel model;
  wstring wtext;
  string line;
  
  NJamSpell::TLangModel::TLangModel((TLangModel *)local_168);
  poVar2 = std::operator<<((ostream *)&std::cerr,"[info] loading model");
  std::endl<char,std::char_traits<char>>(poVar2);
  bVar1 = NJamSpell::TLangModel::Load((TLangModel *)local_168,modelFile);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"[info] loaded");
    std::endl<char,std::char_traits<char>>(poVar2);
    std::operator<<((ostream *)&std::cerr,">> ");
    wtext.field_2._8_8_ = &line._M_string_length;
    line._M_dataplus._M_p = (pointer)0x0;
    line._M_string_length._0_1_ = 0;
    text = (string *)((long)&wtext.field_2 + 8);
    __return_storage_ptr__ = &model.CheckSum;
    while( true ) {
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&std::cin,(string *)text);
      if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
      NJamSpell::UTF8ToWide((wstring *)__return_storage_ptr__,text);
      dVar5 = NJamSpell::TLangModel::Score
                        ((TLangModel *)local_168,(wstring *)__return_storage_ptr__);
      poVar2 = std::ostream::_M_insert<double>(dVar5);
      std::operator<<(poVar2,"\n");
      std::operator<<((ostream *)&std::cerr,">> ");
      std::__cxx11::wstring::~wstring((wstring *)__return_storage_ptr__);
    }
    std::__cxx11::string::~string((string *)((long)&wtext.field_2 + 8));
    iVar4 = 0;
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,"[error] failed to load model");
    std::endl<char,std::char_traits<char>>(poVar2);
    iVar4 = 0x2a;
  }
  NJamSpell::TLangModel::~TLangModel((TLangModel *)local_168);
  return iVar4;
}

Assistant:

int Score(const std::string& modelFile) {
    TLangModel model;
    std::cerr << "[info] loading model" << std::endl;
    if (!model.Load(modelFile)) {
        std::cerr << "[error] failed to load model" << std::endl;
        return 42;
    }
    std::cerr << "[info] loaded" << std::endl;
    std::cerr << ">> ";
    for (std::string line; std::getline(std::cin, line);) {
        std::wstring wtext = UTF8ToWide(line);
        std::cerr << model.Score(wtext) << "\n";
        std::cerr << ">> ";
    }
    return 0;
}